

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.c
# Opt level: O1

int chain_segment_mix(mixed_segment *segment)

{
  long *plVar1;
  code *pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  plVar1 = (long *)segment->data;
  uVar5 = (ulong)*(uint *)(plVar1 + 1);
  bVar6 = uVar5 == 0;
  if (!bVar6) {
    uVar4 = 1;
    do {
      pcVar2 = *(code **)(*(long *)(*plVar1 + -8 + uVar4 * 8) + 0x18);
      if (pcVar2 != (code *)0x0) {
        iVar3 = (*pcVar2)();
        if (iVar3 == 0) break;
      }
      bVar6 = uVar5 <= uVar4;
      bVar7 = uVar4 != uVar5;
      uVar4 = uVar4 + 1;
    } while (bVar7);
  }
  return (uint)bVar6;
}

Assistant:

int chain_segment_mix(struct mixed_segment *segment){
  struct vector *data = (struct vector *)segment->data;
  uint32_t count = data->count;
  for(uint32_t i=0; i<count; ++i){
    struct mixed_segment *segment = (struct mixed_segment *)data->data[i];
    if(segment->mix){
      if(!segment->mix(segment)){
        return 0;
      }
    }
  }
  return 1;
}